

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.h
# Opt level: O0

int KeepAlivegpControl(GPCONTROL *pgpControl)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined1 local_148 [4];
  int salen;
  sockaddr_in sa;
  char streamingstatustmp [256];
  char *pcStack_30;
  int BytesReceived;
  char *body;
  char *title;
  char *ptr;
  GPCONTROL *pgpControl_local;
  
  title = (char *)0x0;
  body = (char *)0x0;
  pcStack_30 = (char *)0x0;
  streamingstatustmp[0xfc] = '\0';
  streamingstatustmp[0xfd] = '\0';
  streamingstatustmp[0xfe] = '\0';
  streamingstatustmp[0xff] = '\0';
  ptr = (char *)pgpControl;
  memset(local_148,0,0x10);
  local_148._0_2_ = 2;
  iVar1 = atoi(ptr + 0x210);
  local_148._2_2_ = htons((uint16_t)iVar1);
  salen = inet_addr(ptr + 0x110);
  sendto(*(int *)(ptr + 8),"_GPHD_:0:0:2:0.000000",0x16,0,(sockaddr *)local_148,0x10);
  if (*(int *)(ptr + 0x538) == 0) {
    if ((*(int *)(ptr + 0x530) != 0) &&
       (iVar1 = inittcpcli((SOCKET *)(ptr + 0x318),ptr + 0x110,"80"), iVar1 != 0)) {
      printf("Error communicating with a gpControl.\n");
      return 1;
    }
    iVar1 = sendsimplehttpgetreq(*(SOCKET *)(ptr + 0x318),ptr + 0x83c);
    if (iVar1 != 0) {
      printf("Error communicating with a gpControl.\n");
      if (*(int *)(ptr + 0x530) != 0) {
        releasetcpcli(*(SOCKET *)(ptr + 0x318));
      }
      return 1;
    }
    iVar1 = recvsimplehtml(*(SOCKET *)(ptr + 0x318),&body,&stack0xffffffffffffffd0,0x100,
                           (int *)(streamingstatustmp + 0xfc));
    if (iVar1 != 0) {
      printf("Error communicating with a gpControl.\n");
      if (*(int *)(ptr + 0x530) != 0) {
        releasetcpcli(*(SOCKET *)(ptr + 0x318));
      }
      return 1;
    }
    if ((*(int *)(ptr + 0x530) != 0) &&
       (iVar1 = releasetcpcli(*(SOCKET *)(ptr + 0x318)), iVar1 != 0)) {
      printf("Error communicating with a gpControl.\n");
      return 1;
    }
    sprintf((char *)sa.sin_zero,"\"%d\":",(ulong)*(uint *)(ptr + 0x93c));
    pcVar2 = strstr(pcStack_30,(char *)sa.sin_zero);
    title = pcVar2;
    if ((pcVar2 == (char *)0x0) || (sVar3 = strlen((char *)sa.sin_zero), pcVar2[sVar3] != '1')) {
      printf("Error communicating with a gpControl.\n");
      free(body);
      free(pcStack_30);
      return 1;
    }
    free(body);
    free(pcStack_30);
  }
  return 0;
}

Assistant:

inline int KeepAlivegpControl(GPCONTROL* pgpControl)
{
	char* ptr = NULL;
	char* title = NULL;
	char* body = NULL;
	int BytesReceived = 0;
	char streamingstatustmp[256];
	struct sockaddr_in sa;
	int salen = sizeof(sa);
	

	memset(&sa, 0, sizeof(sa));
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(pgpControl->RS232Port.port));
	sa.sin_addr.s_addr = inet_addr(pgpControl->RS232Port.address);
	
	// Keep-alive...
	sendto(pgpControl->RS232Port.s, "_GPHD_:0:0:2:0.000000", sizeof("_GPHD_:0:0:2:0.000000"), 0, (struct sockaddr*)&sa, salen);
	

	if (!pgpControl->bDisableStatusCheck)
	{
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (inittcpcli(&pgpControl->tcpsock, pgpControl->RS232Port.address, "80") != EXIT_SUCCESS)
			{
				printf("Error communicating with a gpControl.\n");
				return EXIT_FAILURE;
			}
		}
		if (sendsimplehttpgetreq(pgpControl->tcpsock, pgpControl->statushttpreq) != EXIT_SUCCESS)
		{
			printf("Error communicating with a gpControl.\n");
			if (pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			return EXIT_FAILURE;
		}
		if (recvsimplehtml(pgpControl->tcpsock, &title, &body, MAX_NB_BYTES_GPCONTROL, &BytesReceived) != EXIT_SUCCESS)
		{
			printf("Error communicating with a gpControl.\n");
			if (pgpControl->bDisableHTTPPersistent) releasetcpcli(pgpControl->tcpsock);
			return EXIT_FAILURE;
		}
		if (pgpControl->bDisableHTTPPersistent)
		{
			if (releasetcpcli(pgpControl->tcpsock) != EXIT_SUCCESS)
			{
				printf("Error communicating with a gpControl.\n");
				return EXIT_FAILURE;
			}
		}
		sprintf(streamingstatustmp, "\"%d\":", pgpControl->streamingstatusid);
		ptr = strstr(body, streamingstatustmp);
		if ((ptr == NULL)||(ptr[strlen(streamingstatustmp)] != '1'))
		{
			printf("Error communicating with a gpControl.\n");
			free(title);
			free(body);
			return EXIT_FAILURE;
		}
		free(title);
		free(body);
	}

	return EXIT_SUCCESS;
}